

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryPool.cpp
# Opt level: O0

VkResult __thiscall
myvk::QueryPool::GetResults64
          (QueryPool *this,uint32_t first_query,uint32_t query_count,uint64_t *data,
          VkQueryResultFlags flags)

{
  PFN_vkGetQueryPoolResults p_Var1;
  VkResult VVar2;
  element_type *this_00;
  VkDevice pVVar3;
  void *in_RCX;
  uint in_EDX;
  uint32_t in_ESI;
  long in_RDI;
  uint in_R8D;
  
  p_Var1 = vkGetQueryPoolResults;
  this_00 = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2e995d);
  pVVar3 = Device::GetHandle(this_00);
  VVar2 = (*p_Var1)(pVVar3,*(VkQueryPool *)(in_RDI + 0x28),in_ESI,in_EDX,(ulong)in_EDX << 3,in_RCX,8
                    ,in_R8D | 1);
  return VVar2;
}

Assistant:

VkResult QueryPool::GetResults64(uint32_t first_query, uint32_t query_count, uint64_t *data,
                                 VkQueryResultFlags flags) const {
	return vkGetQueryPoolResults(m_device_ptr->GetHandle(), m_query_pool, first_query, query_count,
	                             query_count * sizeof(uint64_t), (void *)data, sizeof(uint64_t),
	                             flags | VK_QUERY_RESULT_64_BIT);
}